

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O1

unsigned_long_long strpool_inject(strpool_t *pool,char *string,int length)

{
  char cVar1;
  strpool_internal_hash_slot_t *psVar2;
  strpool_internal_entry_t *__src;
  strpool_internal_block_t *psVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  strpool_internal_hash_slot_t *__s;
  long lVar10;
  strpool_internal_entry_t *psVar11;
  strpool_internal_handle_t *psVar12;
  char **ppcVar13;
  uint uVar14;
  char cVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  ulong __n;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  strpool_internal_handle_t *psVar25;
  int iVar26;
  strpool_internal_handle_t *__src_00;
  uint uVar27;
  bool bVar28;
  unsigned_long_long local_58;
  
  uVar27 = 0;
  if (length < 1 || string == (char *)0x0) {
    return 0;
  }
  __n = (ulong)(uint)length;
  if (0 < (long)pool->block_count) {
    lVar17 = 0;
    do {
      lVar10 = *(long *)((long)&pool->blocks->data + lVar17);
      bVar28 = true;
      if (((char *)(lVar10 + 8U) <= string) &&
         (string < (char *)(lVar10 + *(int *)((long)&pool->blocks->capacity + lVar17)))) {
        bVar28 = false;
        uVar27 = 0;
        if (*(int *)(string + -4) == length) {
          bVar28 = false;
          uVar27 = 0;
          if (string[__n] == '\0') {
            uVar27 = *(uint *)(string + -8);
            bVar28 = false;
          }
        }
      }
      if (!bVar28) goto LAB_00146e15;
      lVar17 = lVar17 + 0x20;
    } while ((long)pool->block_count * 0x20 != lVar17);
    uVar27 = 0;
  }
LAB_00146e15:
  if (uVar27 != 0) goto LAB_00146e94;
  if (pool->ignore_case == 0) {
    if (length < 1) goto LAB_00146e86;
    uVar27 = 0x1505;
    uVar9 = 0;
    do {
      uVar27 = uVar27 * 0x21 ^ (int)string[uVar9];
      uVar9 = uVar9 + 1;
    } while (__n != uVar9);
  }
  else if (length < 1) {
LAB_00146e86:
    uVar27 = 0x1505;
  }
  else {
    uVar27 = 0x1505;
    uVar9 = 0;
    do {
      cVar1 = string[uVar9];
      cVar15 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar15 = cVar1;
      }
      uVar27 = (int)cVar15 ^ uVar27 * 0x21;
      uVar9 = uVar9 + 1;
    } while (__n != uVar9);
  }
  uVar27 = uVar27 + (uVar27 == 0);
LAB_00146e94:
  iVar8 = pool->hash_capacity;
  lVar17 = (long)iVar8;
  uVar18 = iVar8 - 1;
  uVar21 = uVar18 & uVar27;
  psVar2 = pool->hash_table;
  iVar26 = psVar2[(int)uVar21].base_count;
  psVar25 = (strpool_internal_handle_t *)(ulong)uVar21;
  uVar19 = uVar21;
  while (0 < iVar26) {
    uVar14 = psVar2[(int)uVar19].hash_key;
    if ((uVar14 == 0) && (psVar2[(int)psVar25].hash_key != 0)) {
      psVar25 = (strpool_internal_handle_t *)(ulong)uVar19;
    }
    if (((uVar14 & uVar18) == uVar21) && (iVar26 = iVar26 + -1, uVar14 == uVar27)) {
      iVar7 = psVar2[(int)uVar19].entry_index;
      psVar11 = pool->entries;
      bVar28 = true;
      if (psVar11[iVar7].length == length) {
        if (pool->ignore_case == 0) {
          iVar6 = bcmp(psVar11[iVar7].data + 8,string,__n);
        }
        else {
          iVar6 = strncasecmp(psVar11[iVar7].data + 8,string,__n);
        }
        bVar28 = true;
        if (iVar6 == 0) {
          local_58 = (long)psVar11[iVar7].handle_index + 1U & pool->index_mask |
                     ((long)pool->handles[psVar11[iVar7].handle_index].counter & pool->counter_mask)
                     << ((byte)pool->counter_shift & 0x3f);
          bVar28 = false;
        }
      }
      if (bVar28) goto LAB_00146fd4;
      bVar28 = false;
    }
    else {
LAB_00146fd4:
      uVar19 = uVar19 + 1 & uVar18;
      bVar28 = true;
    }
    if (!bVar28) {
      return local_58;
    }
  }
  iVar7 = (int)((ulong)(lVar17 * 0x55555555) >> 0x20) - iVar8;
  if (((iVar7 >> 1) - (iVar7 >> 0x1f)) + iVar8 <= pool->entry_count) {
    pool->hash_capacity = iVar8 * 2;
    __s = (strpool_internal_hash_slot_t *)malloc(lVar17 * 0x18);
    pool->hash_table = __s;
    if (__s == (strpool_internal_hash_slot_t *)0x0) {
      __assert_fail("( pool->hash_table ) && ( \"Allocation failed\" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                    ,0x346,"void strpool_internal_expand_hash_table(strpool_t *)");
    }
    memset(__s,0,lVar17 * 0x18);
    if (0 < iVar8) {
      uVar19 = iVar8 * 2 - 1;
      lVar10 = 0;
      do {
        uVar18 = psVar2[lVar10].hash_key;
        if (uVar18 != 0) {
          uVar14 = uVar18 & uVar19;
          lVar22 = (long)(int)uVar14;
          uVar21 = __s[lVar22].hash_key;
          lVar23 = lVar22;
          while (uVar21 != 0) {
            uVar14 = uVar14 + 1 & uVar19;
            lVar23 = (long)(int)uVar14;
            uVar21 = __s[lVar23].hash_key;
          }
          __s[lVar23].hash_key = uVar18;
          iVar8 = psVar2[lVar10].entry_index;
          __s[lVar23].entry_index = iVar8;
          pool->entries[iVar8].hash_slot = uVar14;
          __s[lVar22].base_count = __s[lVar22].base_count + 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar17);
    }
    free(psVar2);
    uVar19 = pool->hash_capacity - 1;
    uVar21 = uVar19 & uVar27;
    if (iVar26 == 0) {
      psVar25 = (strpool_internal_handle_t *)(ulong)uVar21;
    }
    else {
      psVar25 = (strpool_internal_handle_t *)(ulong)uVar21;
      uVar18 = uVar21;
      do {
        uVar14 = pool->hash_table[(int)uVar18].hash_key;
        if ((uVar14 == 0) && (pool->hash_table[(int)psVar25].hash_key != 0)) {
          psVar25 = (strpool_internal_handle_t *)(ulong)uVar18;
        }
        uVar18 = uVar18 + 1 & uVar19;
        iVar26 = iVar26 - (uint)((uVar14 & uVar19) == uVar21);
      } while (iVar26 != 0);
    }
  }
  __src_00 = (strpool_internal_handle_t *)(long)(int)psVar25;
  if (pool->hash_table[(int)psVar25].hash_key != 0) {
    do {
      psVar25 = (strpool_internal_handle_t *)
                ((long)(int)psVar25 + 1U & (long)pool->hash_capacity - 1U);
      __src_00 = psVar25;
    } while (pool->hash_table[(long)psVar25].hash_key != 0);
  }
  iVar8 = pool->entry_count;
  iVar26 = pool->entry_capacity;
  if (iVar26 <= iVar8) {
    pool->entry_capacity = iVar26 * 2;
    psVar11 = (strpool_internal_entry_t *)malloc((long)iVar26 << 6);
    if (psVar11 == (strpool_internal_entry_t *)0x0) {
      __assert_fail("( new_entries ) && ( \"Allocation failed\" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                    ,0x363,"void strpool_internal_expand_entries(strpool_t *)");
    }
    __src = pool->entries;
    memcpy(psVar11,__src,(long)iVar8 << 5);
    free(__src);
    pool->entries = psVar11;
  }
  psVar2 = pool->hash_table;
  if ((psVar2[(long)__src_00].hash_key != 0) || ((pool->hash_capacity - 1U & uVar27) != uVar21)) {
    __assert_fail("( !pool->hash_table[ slot ].hash_key && ( hash & ( (unsigned int) pool->hash_capacity - 1 ) ) == (unsigned int) base_slot ) && ( \"Invalid slot\" )"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                  ,0x3f3,"unsigned long long strpool_inject(strpool_t *, const char *, int)");
  }
  psVar2[(long)__src_00].hash_key = uVar27;
  psVar2[(long)__src_00].entry_index = pool->entry_count;
  psVar2[(int)uVar21].base_count = psVar2[(int)uVar21].base_count + 1;
  iVar8 = pool->handle_count;
  lVar17 = (long)iVar8;
  iVar26 = pool->handle_capacity;
  if (iVar8 < iVar26) {
    pool->handles[lVar17].counter = 1;
    pool->handle_count = iVar8 + 1;
  }
  else {
    iVar8 = pool->handle_freelist_head;
    lVar10 = (long)iVar8;
    if (lVar10 < 0) {
      pool->handle_capacity = iVar26 * 2;
      psVar12 = (strpool_internal_handle_t *)malloc((long)iVar26 << 4);
      if (psVar12 == (strpool_internal_handle_t *)0x0) {
        __assert_fail("( new_handles ) && ( \"Allocation failed\" )",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                      ,0x36f,"void strpool_internal_expand_handles(strpool_t *)");
      }
      __src_00 = pool->handles;
      memcpy(psVar12,__src_00,lVar17 << 3);
      free(__src_00);
      pool->handles = psVar12;
      iVar8 = pool->handle_count;
      psVar12[iVar8].counter = 1;
      pool->handle_count = iVar8 + 1;
    }
    else {
      if (pool->handle_freelist_tail == iVar8) {
        pool->handle_freelist_tail = pool->handles[lVar10].entry_index;
      }
      pool->handle_freelist_head = pool->handles[lVar10].entry_index;
    }
  }
  iVar26 = pool->entry_count;
  pool->handles[iVar8].entry_index = iVar26;
  psVar11 = pool->entries + iVar26;
  pool->entry_count = iVar26 + 1;
  iVar26 = length + 9;
  iVar7 = pool->min_data_size;
  if (pool->min_data_size <= iVar26) {
    iVar7 = iVar26;
  }
  uVar19 = iVar7 - 1U >> 1 | iVar7 - 1U;
  uVar19 = uVar19 >> 2 | uVar19;
  uVar19 = uVar19 >> 4 | uVar19;
  uVar19 = uVar19 >> 8 | uVar19;
  uVar19 = uVar19 >> 0x10 | uVar19;
  iVar7 = uVar19 + 1 + (uint)(uVar19 == 0xffffffff);
  uVar9 = (ulong)pool->block_count;
  bVar28 = 0 < (long)uVar9;
  if (0 < (long)uVar9) {
    psVar3 = pool->blocks;
    bVar28 = true;
    uVar20 = 0;
    do {
      uVar19 = psVar3[uVar20].free_list;
      uVar24 = 0xffffffff;
      do {
        bVar5 = true;
        if ((int)uVar19 < 0) goto LAB_001473d5;
        pcVar4 = psVar3[uVar20].data;
        psVar12 = (strpool_internal_handle_t *)(pcVar4 + uVar19);
        iVar6 = *(int *)(pcVar4 + uVar19);
        if (iVar6 / 2 < iVar7) {
          iVar16 = 6;
          if (iVar7 <= iVar6) {
            if ((int)uVar24 < 0) {
              psVar3[uVar20].free_list = psVar12->counter;
            }
            else {
              *(int *)(pcVar4 + uVar24 + 4) = psVar12->counter;
            }
            iVar16 = 1;
            __src_00 = psVar12;
            iVar26 = iVar6;
          }
        }
        else {
          uVar24 = (ulong)uVar19;
          uVar19 = psVar12->counter;
          iVar16 = 0;
        }
      } while (iVar16 == 0);
      if (iVar16 != 6) {
        bVar5 = iVar7 <= iVar6 / 2;
      }
LAB_001473d5:
      if (!bVar5) break;
      uVar20 = uVar20 + 1;
      bVar28 = uVar20 < uVar9;
    } while (uVar20 != uVar9);
  }
  if (!bVar28) {
    psVar3 = pool->blocks;
    iVar26 = pool->current_block;
    __src_00 = (strpool_internal_handle_t *)psVar3[iVar26].tail;
    if ((*(int *)&psVar3[iVar26].data - (int)__src_00) + psVar3[iVar26].capacity < iVar7) {
      iVar26 = pool->block_size;
      if (pool->block_size < iVar7) {
        iVar26 = iVar7;
      }
      iVar26 = strpool_internal_add_block(pool,iVar26);
      pool->current_block = iVar26;
      ppcVar13 = &pool->blocks[iVar26].tail;
      __src_00 = (strpool_internal_handle_t *)*ppcVar13;
    }
    else {
      ppcVar13 = &psVar3[iVar26].tail;
    }
    *ppcVar13 = (char *)((long)&__src_00->entry_index + (long)iVar7);
    iVar26 = iVar7;
  }
  psVar11->hash_slot = (int)psVar25;
  psVar11->handle_index = iVar8;
  psVar11->data = (char *)__src_00;
  psVar11->size = iVar26;
  psVar11->length = length;
  psVar11->refcount = 0;
  __src_00->entry_index = uVar27;
  __src_00->counter = length;
  memcpy(__src_00 + 1,string,__n);
  *(undefined1 *)((long)&__src_00[1].entry_index + __n) = 0;
  return (long)(iVar8 + 1) & pool->index_mask |
         ((long)pool->handles[iVar8].counter & pool->counter_mask) <<
         ((byte)pool->counter_shift & 0x3f);
}

Assistant:

STRPOOL_U64 strpool_inject( strpool_t* pool, char const* string, int length )
    {
    if( !string || length <= 0 ) return 0;

    STRPOOL_U32 hash = strpool_internal_find_in_blocks( pool, string, length );
    // If no stored hash, calculate it from data
    if( !hash ) hash = strpool_internal_calculate_hash( string, length, pool->ignore_case ); 

    // Return handle to existing string, if it is already in pool
    int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
    int base_count = pool->hash_table[ base_slot ].base_count;
    int slot = base_slot;
    int first_free = slot;
    while( base_count > 0 )
        {
        STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
        if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
        int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        if( slot_base == base_slot ) 
            {
            STRPOOL_ASSERT( base_count > 0, "Invalid base count" );
            --base_count;
            if( slot_hash == hash )
                {
                int index = pool->hash_table[ slot ].entry_index;
                strpool_internal_entry_t* entry = &pool->entries[ index ];
                if( entry->length == length && 
                    ( 
                       ( !pool->ignore_case &&   STRPOOL_MEMCMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 )
                    || (  pool->ignore_case && STRPOOL_STRNICMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 ) 
                    ) 
                  )
                    {
                    int handle_index = entry->handle_index;
                    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, 
                        pool->index_mask, pool->counter_shift, pool->counter_mask );
                    }
                }
            }
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
        }   

    // This is a new string, so let's add it

    if( pool->entry_count >= ( pool->hash_capacity  - pool->hash_capacity / 3 ) )
        {
        strpool_internal_expand_hash_table( pool );

        base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        slot = base_slot;
        first_free = slot;
        while( base_count )
            {
            STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
            if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
            int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
            if( slot_base == base_slot )  --base_count;
            slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
            }       
        }
        
    slot = first_free;
    while( pool->hash_table[ slot ].hash_key )
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );

    if( pool->entry_count >= pool->entry_capacity )
        strpool_internal_expand_entries( pool );

    STRPOOL_ASSERT( !pool->hash_table[ slot ].hash_key && ( hash & ( (STRPOOL_U32) pool->hash_capacity - 1 ) ) == (STRPOOL_U32) base_slot, "Invalid slot" );
    STRPOOL_ASSERT( hash, "Invalid hash" );
    pool->hash_table[ slot ].hash_key = hash;
    pool->hash_table[ slot ].entry_index = pool->entry_count;
    ++pool->hash_table[ base_slot ].base_count;

    int handle_index;

    if( pool->handle_count < pool->handle_capacity )
        {
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }
    else if( pool->handle_freelist_head >= 0 )
        {
        handle_index = pool->handle_freelist_head;
        if( pool->handle_freelist_tail == pool->handle_freelist_head ) 
            pool->handle_freelist_tail = pool->handles[ pool->handle_freelist_head ].entry_index;
        pool->handle_freelist_head = pool->handles[ pool->handle_freelist_head ].entry_index;                       
        }
    else
        {
        strpool_internal_expand_handles( pool );
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }

    pool->handles[ handle_index ].entry_index = pool->entry_count;
        
    strpool_internal_entry_t* entry = &pool->entries[ pool->entry_count ];
    ++pool->entry_count;
        
    int data_size = length + 1 + (int) ( 2 * sizeof( STRPOOL_U32 ) );
    char* data = strpool_internal_get_data_storage( pool, data_size, &data_size );
    entry->hash_slot = slot;
    entry->handle_index = handle_index;
    entry->data = data;
    entry->size = data_size;
    entry->length = length;
    entry->refcount = 0;

    *(STRPOOL_U32*)(data) = hash;
    data += sizeof( STRPOOL_U32 );
    *(STRPOOL_U32*)(data) = (STRPOOL_U32) length;
    data += sizeof( STRPOOL_U32 );
    STRPOOL_MEMCPY( data, string, (size_t) length ); 
    data[ length ] = 0; // Ensure trailing zero

    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, pool->index_mask, 
        pool->counter_shift, pool->counter_mask );
    }